

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GMAA_MAA_ELSI.cpp
# Opt level: O2

void __thiscall GMAA_MAA_ELSI::SelectPoliciesToProcessFurther(GMAA_MAA_ELSI *this)

{
  bool in_DL;
  PartialPolicyPoolInterface_sharedPtr *in_RSI;
  double in_XMM0_Qa;
  
  SelectPoliciesToProcessFurther(this,in_RSI,in_DL,in_XMM0_Qa);
  return;
}

Assistant:

void GMAA_MAA_ELSI::SelectPoliciesToProcessFurther(
    const PartialPolicyPoolInterface_sharedPtr &poolOfNextPolicies,
    bool are_LBs, double bestLB)
{
    //for MAA*, all policies are processed further when they aren't full
    //policies (i.e. lower bounds)
    //so, unless these are full policies...
    if(are_LBs)
    {
        while(!poolOfNextPolicies->Empty())
            poolOfNextPolicies->Pop();
    }
    //we can return immediately...
    return;
}